

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O2

bool __thiscall
OpenMD::SelectionEvaluator::loadScriptString(SelectionEvaluator *this,string *script)

{
  bool bVar1;
  allocator<char> local_39;
  string local_38;
  
  clearState(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
  bVar1 = loadScript(this,&local_38,script);
  std::__cxx11::string::~string((string *)&local_38);
  return bVar1;
}

Assistant:

bool SelectionEvaluator::loadScriptString(const std::string& script) {
    clearState();
    return loadScript("", script);
  }